

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeCommander.cpp
# Opt level: O0

void cmd_util::dumpEntryInfo(ExeElementWrapper *w)

{
  bool bVar1;
  char cVar2;
  addr_type type;
  ostream *poVar3;
  ulong uVar4;
  qsizetype qVar5;
  string local_160;
  undefined1 local_140 [8];
  QString translated;
  undefined1 local_100 [3];
  char c;
  addr_type aType;
  QString str;
  WrappedValue value;
  size_t y;
  size_t subfields;
  string local_98;
  int local_74;
  ulong local_70;
  offset_t offset;
  size_t i;
  QString local_50;
  string local_38;
  ulong local_18;
  size_t fields;
  ExeElementWrapper *w_local;
  
  if (w != (ExeElementWrapper *)0x0) {
    fields = (size_t)w;
    std::operator<<((ostream *)&std::cout,"\n------\n");
    local_18 = (**(code **)(*(long *)fields + 0x78))();
    poVar3 = std::operator<<((ostream *)&std::cout,"[");
    (**(code **)(*(long *)fields + 0x70))();
    QString::toStdString_abi_cxx11_(&local_38,&local_50);
    poVar3 = std::operator<<(poVar3,(string *)&local_38);
    poVar3 = std::operator<<(poVar3,"] ");
    poVar3 = std::operator<<(poVar3,"size: 0x");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
    uVar4 = (**(code **)(*(long *)fields + 0x68))();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"fieldsCount: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::dec);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
    poVar3 = std::operator<<(poVar3,"\n");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_38);
    QString::~QString(&local_50);
    for (offset = 0; offset < local_18; offset = offset + 1) {
      local_70 = (**(code **)(*(long *)fields + 0xa0))(fields,offset,0xffffffffffffffff);
      if (local_70 != 0xffffffffffffffff) {
        std::ios::fill((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
        poVar3 = std::operator<<((ostream *)&std::cout,"[");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
        local_74 = (int)std::setw(8);
        poVar3 = std::operator<<(poVar3,(_Setw)local_74);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_70);
        std::operator<<(poVar3,"]");
        poVar3 = std::operator<<((ostream *)&std::cout," ");
        (**(code **)(*(long *)fields + 0xb8))((QString *)&subfields,fields,offset);
        QString::toStdString_abi_cxx11_(&local_98,(QString *)&subfields);
        poVar3 = std::operator<<(poVar3,(string *)&local_98);
        std::operator<<(poVar3,"\t");
        std::__cxx11::string::~string((string *)&local_98);
        QString::~QString((QString *)&subfields);
        y = (**(code **)(*(long *)fields + 0x80))();
        if (y == 0) {
          y = 1;
        }
        for (value.m_Size = 0; value.m_Size < y; value.m_Size = value.m_Size + 1) {
          (**(code **)(*(long *)fields + 0xc0))(&str.d.size,fields,offset,value.m_Size);
          bVar1 = WrappedValue::isValid((WrappedValue *)&str.d.size);
          if (!bVar1) break;
          WrappedValue::toQString((QString *)local_100,(WrappedValue *)&str.d.size);
          type = (**(code **)(*(long *)fields + 0xd0))(fields,offset,value.m_Size);
          cVar2 = addrTypeToChar(type);
          poVar3 = std::operator<<((ostream *)&std::cout,"[");
          QString::toStdString_abi_cxx11_((string *)&translated.d.size,(QString *)local_100);
          poVar3 = std::operator<<(poVar3,(string *)&translated.d.size);
          poVar3 = std::operator<<(poVar3," ");
          poVar3 = std::operator<<(poVar3,cVar2);
          std::operator<<(poVar3,"]");
          std::__cxx11::string::~string((string *)&translated.d.size);
          QString::~QString((QString *)local_100);
        }
        (**(code **)(*(long *)fields + 0xa8))((QString *)local_140,fields,offset);
        qVar5 = QString::size((QString *)local_140);
        if (0 < qVar5) {
          poVar3 = std::operator<<((ostream *)&std::cout," ");
          QString::toStdString_abi_cxx11_(&local_160,(QString *)local_140);
          poVar3 = std::operator<<(poVar3,(string *)&local_160);
          std::operator<<(poVar3," ");
          std::__cxx11::string::~string((string *)&local_160);
        }
        std::operator<<((ostream *)&std::cout,"\n");
        QString::~QString((QString *)local_140);
      }
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"------");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void cmd_util::dumpEntryInfo(ExeElementWrapper *w)
{
    if (w == NULL) return;
    
    std::cout << "\n------\n";
    size_t fields = w->getFieldsCount();
    
    std::cout << "[" << w->getName().toStdString() << "] "
        << "size: 0x" << std::hex << w->getSize()
        << " " 
        << "fieldsCount: " << std::dec << fields << "\n" 
        << std::endl;

    for (size_t i = 0; i < fields; i++) {
        offset_t offset = w->getFieldOffset(i);
        if (offset == INVALID_ADDR) {
            continue;
        }
        OUT_PADDED_OFFSET(std::cout, offset);
        std::cout << " " << w->getFieldName(i).toStdString() << "\t";

        size_t subfields = w->getSubFieldsCount();
        if (subfields == 0) subfields = 1; //it may not have a sublist, but a single value
        
        for (size_t y = 0; y < subfields; y++) {
            WrappedValue value = w->getWrappedValue(i, y);
            if (!value.isValid()) break;
            
            QString str = value.toQString();

            Executable::addr_type aType = w->containsAddrType(i, y);
            char c = addrTypeToChar(aType);
            std::cout << "[" << str.toStdString() << " " << c << "]";
        }

        QString translated = w->translateFieldContent(i);
        if (translated.size() > 0) {
            std::cout << " " << translated.toStdString() << " ";
        }
        std::cout << "\n";
    }
    std::cout << "------" << std::endl;
}